

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

void af_latin_hints_link_segments
               (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  char cVar1;
  short sVar2;
  undefined2 uVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  AF_Direction AVar7;
  AF_Segment pAVar8;
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  AF_Segment_conflict pAVar13;
  AF_Segment pAVar14;
  short sVar15;
  FT_Pos FVar16;
  FT_Pos pos1;
  AF_Segment_conflict pAVar17;
  AF_Segment_conflict pAVar18;
  
  pAVar13 = hints->axis[dim].segments;
  iVar5 = hints->axis[dim].num_segments;
  if (width_count == 0) {
    FVar16 = 0;
  }
  else {
    FVar16 = widths[width_count - 1].org;
  }
  pAVar14 = pAVar13 + iVar5;
  uVar6 = *(uint *)&hints->metrics[1].style_class;
  uVar11 = 1;
  if (0xff < (ulong)uVar6) {
    uVar11 = (ulong)(uVar6 >> 8);
  }
  if (0 < iVar5) {
    AVar7 = hints->axis[dim].major_dir;
    pAVar18 = pAVar13;
    do {
      cVar1 = pAVar18->dir;
      if (AVar7 == cVar1) {
        sVar2 = pAVar18->pos;
        pAVar17 = pAVar13;
        do {
          if (sVar2 < pAVar17->pos && (int)pAVar17->dir + (int)cVar1 == 0) {
            uVar3 = pAVar18->max_coord;
            sVar15 = pAVar17->min_coord;
            if (pAVar17->min_coord < pAVar18->min_coord) {
              sVar15 = pAVar18->min_coord;
            }
            sVar4 = pAVar17->max_coord;
            if ((short)uVar3 < sVar4) {
              sVar4 = uVar3;
            }
            if ((long)uVar11 <= (long)sVar4 - (long)sVar15) {
              uVar12 = (long)pAVar17->pos - (long)sVar2;
              if (FVar16 != 0) {
                lVar10 = (long)(uVar12 * 0x400) / FVar16;
                uVar12 = 32000;
                if (lVar10 < 0x2b11) {
                  if (lVar10 < 0x401) {
                    uVar12 = 0;
                  }
                  else {
                    uVar12 = (ulong)((lVar10 + -0x400) * (lVar10 + -0x400)) / 3000;
                  }
                }
              }
              auVar9._8_8_ = 0;
              auVar9._0_8_ = (ulong)uVar6 * 6000 >> 0xb;
              lVar10 = SUB168(auVar9 / SEXT816((long)sVar4 - (long)sVar15),0) + uVar12;
              if (lVar10 < pAVar18->score) {
                pAVar18->score = lVar10;
                pAVar18->link = pAVar17;
              }
              if (lVar10 < pAVar17->score) {
                pAVar17->score = lVar10;
                pAVar17->link = pAVar18;
              }
            }
          }
          pAVar17 = pAVar17 + 1;
        } while (pAVar17 < pAVar14);
      }
      pAVar18 = pAVar18 + 1;
    } while (pAVar18 < pAVar14);
  }
  if (0 < iVar5) {
    do {
      pAVar8 = pAVar13->link;
      if ((pAVar8 != (AF_Segment)0x0) && (pAVar13 != pAVar8->link)) {
        pAVar13->link = (AF_Segment)0x0;
        pAVar13->serif = pAVar8->link;
      }
      pAVar13 = pAVar13 + 1;
    } while (pAVar13 < pAVar14);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_hints_link_segments( AF_GlyphHints  hints,
                                FT_UInt        width_count,
                                AF_WidthRec*   widths,
                                AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = segments + axis->num_segments;
    FT_Pos        len_threshold, len_score, dist_score, max_width;
    AF_Segment    seg1, seg2;


    if ( width_count )
      max_width = widths[width_count - 1].org;
    else
      max_width = 0;

    /* a heuristic value to set up a minimum value for overlapping */
    len_threshold = AF_LATIN_CONSTANT( hints->metrics, 8 );
    if ( len_threshold == 0 )
      len_threshold = 1;

    /* a heuristic value to weight lengths */
    len_score = AF_LATIN_CONSTANT( hints->metrics, 6000 );

    /* a heuristic value to weight distances (no call to    */
    /* AF_LATIN_CONSTANT needed, since we work on multiples */
    /* of the stem width)                                   */
    dist_score = 3000;

    /* now compare each segment to the others */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      if ( seg1->dir != axis->major_dir )
        continue;

      /* search for stems having opposite directions, */
      /* with seg1 to the `left' of seg2              */
      for ( seg2 = segments; seg2 < segment_limit; seg2++ )
      {
        FT_Pos  pos1 = seg1->pos;
        FT_Pos  pos2 = seg2->pos;


        if ( seg1->dir + seg2->dir == 0 && pos2 > pos1 )
        {
          /* compute distance between the two segments */
          FT_Pos  min = seg1->min_coord;
          FT_Pos  max = seg1->max_coord;
          FT_Pos  len;


          if ( min < seg2->min_coord )
            min = seg2->min_coord;

          if ( max > seg2->max_coord )
            max = seg2->max_coord;

          /* compute maximum coordinate difference of the two segments */
          /* (this is, how much they overlap)                          */
          len = max - min;
          if ( len >= len_threshold )
          {
            /*
             *  The score is the sum of two demerits indicating the
             *  `badness' of a fit, measured along the segments' main axis
             *  and orthogonal to it, respectively.
             *
             *  o The less overlapping along the main axis, the worse it
             *    is, causing a larger demerit.
             *
             *  o The nearer the orthogonal distance to a stem width, the
             *    better it is, causing a smaller demerit.  For simplicity,
             *    however, we only increase the demerit for values that
             *    exceed the largest stem width.
             */

            FT_Pos  dist = pos2 - pos1;

            FT_Pos  dist_demerit, score;


            if ( max_width )
            {
              /* distance demerits are based on multiples of `max_width'; */
              /* we scale by 1024 for getting more precision              */
              FT_Pos  delta = ( dist << 10 ) / max_width - ( 1 << 10 );


              if ( delta > 10000 )
                dist_demerit = 32000;
              else if ( delta > 0 )
                dist_demerit = delta * delta / dist_score;
              else
                dist_demerit = 0;
            }
            else
              dist_demerit = dist; /* default if no widths available */

            score = dist_demerit + len_score / len;

            /* and we search for the smallest score */
            if ( score < seg1->score )
            {
              seg1->score = score;
              seg1->link  = seg2;
            }

            if ( score < seg2->score )
            {
              seg2->score = score;
              seg2->link  = seg1;
            }
          }
        }
      }
    }

    /* now compute the `serif' segments, cf. explanations in `afhints.h' */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      seg2 = seg1->link;

      if ( seg2 )
      {
        if ( seg2->link != seg1 )
        {
          seg1->link  = 0;
          seg1->serif = seg2->link;
        }
      }
    }
  }